

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

bool __thiscall
units::fixed_precise_measurement::operator==
          (fixed_precise_measurement *this,precise_measurement *val)

{
  bool bVar1;
  double local_40;
  precise_unit local_28;
  precise_measurement *local_18;
  precise_measurement *val_local;
  fixed_precise_measurement *this_local;
  
  local_18 = val;
  val_local = (precise_measurement *)this;
  local_28 = precise_measurement::units(val);
  bVar1 = precise_unit::operator==(&this->units_,&local_28);
  if (bVar1) {
    local_40 = precise_measurement::value(local_18);
  }
  else {
    local_40 = precise_measurement::value_as(local_18,&this->units_);
  }
  bVar1 = operator==(this,local_40);
  return bVar1;
}

Assistant:

bool operator==(const precise_measurement& val) const
    {
        return operator==(
            (units_ == val.units()) ? val.value() : val.value_as(units_));
    }